

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O1

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,54,1,0,54,1>>
               (Matrix<double,_54,_1,_0,_54,_1> *result,
               ChIntegrable3D<Eigen::Matrix<double,_54,_1,_0,_54,_1>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ChQuadratureTables *pCVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ActualDstType actualDst;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  pointer pvVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Matrix<double,_54,_1,_0,_54,_1> val;
  ChQuadratureTables *local_240;
  pointer local_238;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  pCVar7 = GetStaticTables();
  uVar14 = ((long)(pCVar7->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pCVar7->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar14 < (uint)order) {
    local_240 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(local_240,order,order);
    ChQuadratureTables::PrintTables(local_240);
    local_238 = (local_240->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pvVar18 = (local_240->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_240 = GetStaticTables();
    pvVar18 = (local_240->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_238 = (local_240->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  dVar3 = (Xb - Xa) * 0.5;
  dVar4 = (Yb - Ya) * 0.5;
  dVar5 = (Zb - Za) * 0.5;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[1];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[0]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
         array[0] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[1]
       = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[3];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[2]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
         array[2] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[3]
       = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[5];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[4]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
         array[4] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[5]
       = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[7];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[6]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
         array[6] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[7]
       = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[9];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[8]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
         array[8] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[9]
       = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xb];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [10] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
         array[10] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xb] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xd];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xc] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xc] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xd] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xf];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xe] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xe] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xf] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x11];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x10] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x10] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x11] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x13];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x12] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x12] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x13] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x15];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x14] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x14] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x15] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x17];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x16] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x16] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x17] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x19];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x18] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x18] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x19] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x1b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1a] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x1a] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1b] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x1d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1c] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x1c] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1d] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x1f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1e] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x1e] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1f] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x21];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x20] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x20] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x21] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x23];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x22] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x22] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x23] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x25];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x24] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x24] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x25] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x27];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x26] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x26] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x27] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x29];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x28] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x28] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x29] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x2b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2a] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x2a] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2b] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x2d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2c] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x2c] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2d] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x2f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2e] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x2e] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2f] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x31];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x30] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x30] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x31] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x33];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x32] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x32] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x33] = dVar6 * 0.0;
  dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x35];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x34] = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data
           .array[0x34] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x35] = dVar6 * 0.0;
  if ((pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish !=
      (pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar15 = 0;
    do {
      if ((pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar12 = 0;
        do {
          lVar8 = *(long *)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data;
          lVar10 = (long)(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - lVar8;
          if (lVar10 != 0) {
            uVar11 = lVar10 >> 3;
            uVar16 = 1;
            uVar17 = 0;
            do {
              uVar13 = uVar15;
              if ((uVar11 <= uVar15) || (uVar13 = uVar12, uVar11 <= uVar12)) {
LAB_00754693:
                uVar9 = std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar13);
                operator_delete(pvVar18,0x30);
                _Unwind_Resume(uVar9);
              }
              auVar20._8_8_ = 0;
              auVar20._0_8_ = *(ulong *)(lVar8 + uVar15 * 8);
              auVar22._8_8_ = 0;
              auVar22._0_8_ = (Xa + Xb) * 0.5;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = dVar3;
              auVar19 = vfmadd132sd_fma(auVar20,auVar22,auVar19);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)(lVar8 + uVar12 * 8);
              auVar24._8_8_ = 0;
              auVar24._0_8_ = (Ya + Yb) * 0.5;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = dVar4;
              auVar1 = vfmadd132sd_fma(auVar23,auVar24,auVar1);
              auVar25._8_8_ = 0;
              auVar25._0_8_ = *(ulong *)(lVar8 + uVar17 * 8);
              auVar26._8_8_ = 0;
              auVar26._0_8_ = (Za + Zb) * 0.5;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = dVar5;
              auVar2 = vfmadd132sd_fma(auVar25,auVar26,auVar2);
              (*integrand->_vptr_ChIntegrable3D[2])
                        (auVar19._0_8_,auVar1._0_8_,auVar2._0_8_,integrand,&local_1e8);
              lVar8 = *(long *)&(local_238->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl;
              uVar11 = (long)(local_238->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_finish - lVar8 >> 3;
              uVar13 = uVar15;
              if ((uVar11 <= uVar15) ||
                 ((uVar13 = uVar12, uVar11 <= uVar12 || (uVar13 = uVar17, uVar11 <= uVar17))))
              goto LAB_00754693;
              dVar6 = *(double *)(lVar8 + uVar15 * 8) * *(double *)(lVar8 + uVar12 * 8) *
                      *(double *)(lVar8 + uVar17 * 8);
              auVar21._8_8_ = dVar6;
              auVar21._0_8_ = dVar6;
              local_1e8 = dVar6 * local_1e8;
              dStack_1e0 = dVar6 * dStack_1e0;
              local_1d8 = dVar6 * local_1d8;
              dStack_1d0 = dVar6 * dStack_1d0;
              local_1c8 = dVar6 * local_1c8;
              dStack_1c0 = dVar6 * dStack_1c0;
              local_1b8 = dVar6 * local_1b8;
              dStack_1b0 = dVar6 * dStack_1b0;
              local_1a8 = dVar6 * local_1a8;
              dStack_1a0 = dVar6 * dStack_1a0;
              local_198 = dVar6 * local_198;
              dStack_190 = dVar6 * dStack_190;
              local_188 = dVar6 * local_188;
              dStack_180 = dVar6 * dStack_180;
              local_178 = dVar6 * local_178;
              dStack_170 = dVar6 * dStack_170;
              local_168 = dVar6 * local_168;
              dStack_160 = dVar6 * dStack_160;
              local_158 = dVar6 * local_158;
              dStack_150 = dVar6 * dStack_150;
              local_148 = dVar6 * local_148;
              dStack_140 = dVar6 * dStack_140;
              local_138 = dVar6 * local_138;
              dStack_130 = dVar6 * dStack_130;
              local_128 = dVar6 * local_128;
              dStack_120 = dVar6 * dStack_120;
              local_118 = dVar6 * local_118;
              dStack_110 = dVar6 * dStack_110;
              local_108 = dVar6 * local_108;
              dStack_100 = dVar6 * dStack_100;
              local_f8 = vmulpd_avx512vl(auVar21,local_f8);
              local_e8 = vmulpd_avx512vl(auVar21,local_e8);
              local_d8 = vmulpd_avx512vl(auVar21,local_d8);
              local_c8 = vmulpd_avx512vl(auVar21,local_c8);
              local_b8 = vmulpd_avx512vl(auVar21,local_b8);
              local_a8 = vmulpd_avx512vl(auVar21,local_a8);
              local_98 = vmulpd_avx512vl(auVar21,local_98);
              local_88 = vmulpd_avx512vl(auVar21,local_88);
              local_78 = vmulpd_avx512vl(auVar21,local_78);
              local_68 = vmulpd_avx512vl(auVar21,local_68);
              local_58 = vmulpd_avx512vl(auVar21,local_58);
              local_48 = dVar6 * local_48;
              dStack_40 = dVar6 * dStack_40;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[1];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0] =
                   local_1e8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[1] = dStack_1e0 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[3];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[2] =
                   local_1d8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[2];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[3] = dStack_1d0 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[5];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[4] =
                   local_1c8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[4];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[5] = dStack_1c0 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[7];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[6] =
                   local_1b8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[6];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[7] = dStack_1b0 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[9];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[8] =
                   local_1a8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[8];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[9] = dStack_1a0 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0xb];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[10] =
                   local_198 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[10];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0xb] = dStack_190 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0xd];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0xc] =
                   local_188 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0xc];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0xd] = dStack_180 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0xf];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0xe] =
                   local_178 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0xe];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0xf] = dStack_170 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x11];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x10] =
                   local_168 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x10];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x11] = dStack_160 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x13];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x12] =
                   local_158 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x12];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x13] = dStack_150 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x15];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x14] =
                   local_148 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x14];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x15] = dStack_140 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x17];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x16] =
                   local_138 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x16];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x17] = dStack_130 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x19];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x18] =
                   local_128 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x18];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x19] = dStack_120 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x1b];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x1a] =
                   local_118 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x1a];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x1b] = dStack_110 + dVar6;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x1d];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x1c] =
                   local_108 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x1c];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x1d] = dStack_100 + dVar6;
              auVar19 = vaddpd_avx512vl(local_f8,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x1e));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x1e) = auVar19;
              auVar19 = vaddpd_avx512vl(local_e8,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x20));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x20) = auVar19;
              auVar19 = vaddpd_avx512vl(local_d8,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x22));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x22) = auVar19;
              auVar19 = vaddpd_avx512vl(local_c8,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x24));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x24) = auVar19;
              auVar19 = vaddpd_avx512vl(local_b8,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x26));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x26) = auVar19;
              auVar19 = vaddpd_avx512vl(local_a8,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x28));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x28) = auVar19;
              auVar19 = vaddpd_avx512vl(local_98,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x2a));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x2a) = auVar19;
              auVar19 = vaddpd_avx512vl(local_88,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x2c));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x2c) = auVar19;
              auVar19 = vaddpd_avx512vl(local_78,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x2e));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x2e) = auVar19;
              auVar19 = vaddpd_avx512vl(local_68,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x30));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x30) = auVar19;
              auVar19 = vaddpd_avx512vl(local_58,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                  ).m_storage.m_data.array + 0x32));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                m_data.array + 0x32) = auVar19;
              dVar6 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                      m_storage.m_data.array[0x35];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x34] =
                   local_48 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x34];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array[0x35] = dStack_40 + dVar6;
              uVar17 = (ulong)uVar16;
              lVar8 = *(long *)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data;
              uVar11 = (long)(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish - lVar8 >> 3;
              uVar16 = uVar16 + 1;
            } while (uVar17 < uVar11);
          }
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (uVar12 < (ulong)((long)(pvVar18->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_finish -
                                  *(long *)&(pvVar18->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data >> 3));
      }
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (uVar15 < (ulong)((long)(pvVar18->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&(pvVar18->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data >> 3));
  }
  dVar5 = dVar4 * dVar3 * dVar5;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[1];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[0]
       = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[1]
       = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[3];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[2]
       = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[2];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[3]
       = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[5];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[4]
       = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[4];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[5]
       = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[7];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[6]
       = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[6];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[7]
       = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[9];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[8]
       = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[8];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array[9]
       = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xb];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [10] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[10];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xb] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xd];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xc] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage
                  .m_data.array[0xc];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xd] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0xf];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xe] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage
                  .m_data.array[0xe];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0xf] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x11];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x10] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x10];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x11] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x13];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x12] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x12];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x13] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x15];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x14] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x14];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x15] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x17];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x16] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x16];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x17] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x19];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x18] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x18];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x19] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x1b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1a] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x1a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1b] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x1d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1c] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x1c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1d] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x1f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1e] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x1e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x1f] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x21];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x20] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x20];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x21] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x23];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x22] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x22];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x23] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x25];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x24] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x24];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x25] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x27];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x26] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x26];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x27] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x29];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x28] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x28];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x29] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x2b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2a] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x2a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2b] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x2d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2c] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x2c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2d] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x2f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2e] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x2e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x2f] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x31];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x30] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x30];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x31] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x33];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x32] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x32];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x33] = dVar5 * dVar3;
  dVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.
          array[0x35];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x34] = dVar5 * (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                   m_storage.m_data.array[0x34];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
  [0x35] = dVar5 * dVar3;
  if (uVar14 < (uint)order) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_240->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_240->Weight);
    operator_delete(local_240,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }